

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::~RobustnessTestCase(RobustnessTestCase *this)

{
  code *pcVar1;
  RobustnessTestCase *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

RobustnessTestCase::~RobustnessTestCase (void)
{
	deinit();
}